

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfSetKwd(int64_t MshIdx,int KwdCod,int64_t NmbLin,...)

{
  uint uVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  KwdSct *kwd;
  GmfMshSct *msh;
  va_list VarArg;
  int64_t CurPos;
  int *TypTab;
  int typ;
  int i;
  void *in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int *local_178;
  int *local_160;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  undefined1 local_118 [24];
  undefined8 local_100;
  long local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int *local_68;
  long local_60;
  uint local_58 [2];
  int *local_50;
  undefined1 *local_48;
  int64_t local_38;
  long local_30;
  uint local_28;
  int local_24;
  undefined8 local_20;
  int local_14;
  long local_10;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_60 = in_RDI;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  RecBlk((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
         in_stack_fffffffffffffe78,0);
  if ((local_14 < 1) || (0xf0 < local_14)) {
    local_4 = 0;
  }
  else {
    local_68 = (int *)(local_60 + 0x110 + (long)local_14 * 0x3300);
    iVar2 = strcmp(GmfKwdFmt[local_14][2],"sr");
    if ((iVar2 == 0) || (iVar2 = strcmp(GmfKwdFmt[local_14][2],"hr"), iVar2 == 0)) {
      local_48 = local_118;
      local_50 = (int *)&stack0x00000008;
      local_58[1] = 0x30;
      local_68[5] = (int)local_100;
      local_58[0] = 0x28;
      local_30 = local_f8;
      for (local_24 = 0; local_24 < local_68[5]; local_24 = local_24 + 1) {
        local_68[(long)local_24 + 6] = *(int *)(local_f8 + (long)local_24 * 4);
      }
      iVar2 = strcmp("hr",GmfKwdFmt[local_14][2]);
      uVar1 = local_58[0];
      if (iVar2 == 0) {
        iVar3 = (int)((ulong)local_58 >> 0x20);
        if (local_58[0] < 0x29) {
          local_160 = (int *)(local_48 + (int)local_58[0]);
          local_58[0] = local_58[0] + 8;
        }
        else {
          local_160 = local_50;
          local_50 = local_50 + 2;
        }
        local_68[1] = *local_160;
        if (local_58[0] < 0x29) {
          local_178 = (int *)(local_48 + (int)local_58[0]);
          local_58[0] = local_58[0] + 8;
        }
        else {
          local_178 = local_50;
          local_50 = local_50 + 2;
        }
        local_68[2] = *local_178;
        in_stack_fffffffffffffeb4 = uVar1;
      }
    }
    ExpFmt((GmfMshSct *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
    if (*local_68 == 0) {
      local_4 = 0;
    }
    else {
      if (*local_68 == 1) {
        local_68[0x3f2] = 1;
        local_68[0x3f3] = 0;
      }
      else {
        *(undefined8 *)(local_68 + 0x3f2) = local_20;
      }
      if (((*(uint *)(local_60 + 0xc) & 2) != 0) && (*(long *)(local_60 + 0x30) != 0)) {
        local_38 = GetFilPos((GmfMshSct *)0x107f8c);
        iVar3 = SetFilPos((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                          ,(int64_t)in_stack_fffffffffffffe78);
        if (iVar3 == 0) {
          return 0;
        }
        SetPos((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int64_t)in_stack_fffffffffffffe78);
        iVar3 = SetFilPos((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                          ,(int64_t)in_stack_fffffffffffffe78);
        if (iVar3 == 0) {
          return 0;
        }
      }
      if ((*(uint *)(local_60 + 0xc) & 1) == 0) {
        RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
        iVar4 = GetFilPos((GmfMshSct *)0x108202);
        *(int64_t *)(local_60 + 0x30) = iVar4;
        SetPos((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int64_t)in_stack_fffffffffffffe78);
        if (*local_68 != 1) {
          if (*(int *)(local_60 + 4) < 4) {
            local_24 = (int)*(undefined8 *)(local_68 + 0x3f2);
            RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
          }
          else {
            RecDblWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe78);
          }
        }
        if (*local_68 == 3) {
          RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
          for (local_24 = 0; local_24 < local_68[5]; local_24 = local_24 + 1) {
            if (local_68[(long)local_24 + 6] < 5) {
              in_stack_fffffffffffffe80 = local_68[(long)local_24 + 6];
            }
            else {
              in_stack_fffffffffffffe80 = 1;
            }
            local_28 = in_stack_fffffffffffffe80;
            RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
          }
          iVar3 = strcmp("hr",GmfKwdFmt[local_14][2]);
          if (iVar3 == 0) {
            RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
            RecWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
          }
        }
      }
      else {
        fprintf(*(FILE **)(local_60 + 0x300410),"\n%s\n",GmfKwdFmt[local_14][0]);
        if (*local_68 != 1) {
          fprintf(*(FILE **)(local_60 + 0x300410),"%ld\n",*(undefined8 *)(local_68 + 0x3f2));
        }
        if (*local_68 == 3) {
          fprintf(*(FILE **)(local_60 + 0x300410),"%d ",(ulong)(uint)local_68[5]);
          for (local_24 = 0; local_24 < local_68[5]; local_24 = local_24 + 1) {
            if (local_68[(long)local_24 + 6] < 5) {
              local_28 = local_68[(long)local_24 + 6];
            }
            else {
              local_28 = 1;
            }
            fprintf(*(FILE **)(local_60 + 0x300410),"%d ",(ulong)local_28);
          }
          fprintf(*(FILE **)(local_60 + 0x300410),"\n");
        }
        iVar3 = strcmp("hr",GmfKwdFmt[local_14][2]);
        if (iVar3 == 0) {
          fprintf(*(FILE **)(local_60 + 0x300410),"%d %d\n",(ulong)(uint)local_68[1],
                  (ulong)(uint)local_68[2]);
        }
      }
      *(undefined8 *)(local_60 + 0x40) = 0;
      *(long *)(local_60 + 0x38) =
           *(long *)(local_68 + 0x3f2) * (long)local_68[4] * 4 + *(long *)(local_60 + 0x38);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int GmfSetKwd(int64_t MshIdx, int KwdCod, int64_t NmbLin, ...)
{
   int         i, typ, *TypTab;
   int64_t     CurPos;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   RecBlk(msh, msh->buf, 0);

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Read further arguments if this kw is a solution
   if(!strcmp(GmfKwdFmt[ KwdCod ][2], "sr")
   || !strcmp(GmfKwdFmt[ KwdCod ][2], "hr"))
   {
      va_start(VarArg, NmbLin);

      kwd->NmbTyp = va_arg(VarArg, int);
      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         kwd->TypTab[i] = TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
      {
         kwd->deg = va_arg(VarArg, int);
         kwd->NmbNod = va_arg(VarArg, int);
      }

      va_end(VarArg);
   }

   // Setup the kwd info
   ExpFmt(msh, KwdCod);

   if(!kwd->typ)
      return(0);
   else if(kwd->typ == InfKwd)
      kwd->NmbLin = 1;
   else
      kwd->NmbLin = NmbLin;

   // Store the next kwd position in binary file
   if( (msh->typ & Bin) && msh->NexKwdPos )
   {
      CurPos = GetFilPos(msh);

      if(!SetFilPos(msh, msh->NexKwdPos))
         return(0);

      SetPos(msh, CurPos);

      if(!SetFilPos(msh, CurPos))
         return(0);
   }

   // Write the header
   if(msh->typ & Asc)
   {
      fprintf(msh->hdl, "\n%s\n", GmfKwdFmt[ KwdCod ][0]);

      if(kwd->typ != InfKwd)
         fprintf(msh->hdl, INT64_T_FMT"\n", kwd->NmbLin);

      // In case of solution field, write the extended header
      if(kwd->typ == SolKwd)
      {
         fprintf(msh->hdl, "%d ", kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            fprintf(msh->hdl, "%d ", typ);
         }

         fprintf(msh->hdl, "\n");
      }

      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         fprintf(msh->hdl, "%d %d\n", kwd->deg, kwd->NmbNod);
   }
   else
   {
      RecWrd(msh, (unsigned char *)&KwdCod);
      msh->NexKwdPos = GetFilPos(msh);
      SetPos(msh, 0);

      if(kwd->typ != InfKwd)
      {
         if(msh->ver < 4)
         {
            i = (int)kwd->NmbLin;
            RecWrd(msh, (unsigned char *)&i);
         }
         else
            RecDblWrd(msh, (unsigned char *)&kwd->NmbLin);
      }

      // In case of solution field, write the extended header at once
      if(kwd->typ == SolKwd)
      {
         RecWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            RecWrd(msh, (unsigned char *)&typ);
         }

         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            RecWrd(msh, (unsigned char *)&kwd->deg);
            RecWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
      }
   }

   // Reset write buffer position
   msh->pos = 0;

   // Compute the total file size and check if it crosses the 2GB threshold
   msh->siz += kwd->NmbLin * kwd->NmbWrd * WrdSiz;

   return(1);
}